

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

void __thiscall ImGuiWS::~ImGuiWS(ImGuiWS *this)

{
  bool bVar1;
  thread *in_RDI;
  
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1ca6f8);
  Incppect<false>::stop();
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1ca713);
  bVar1 = std::thread::joinable(in_RDI);
  if (bVar1) {
    std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
              ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1ca72f);
    std::thread::join();
  }
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::~unique_ptr
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)in_RDI);
  return;
}

Assistant:

ImGuiWS::~ImGuiWS() {
    m_impl->incpp.stop();
    if (m_impl->worker.joinable()) {
        m_impl->worker.join();
    }
}